

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uhitm.c
# Opt level: O3

boolean hmon(monst *mon,obj *obj,obj *ostack,boolean thrown)

{
  char cVar1;
  monst *pmVar2;
  boolean bVar3;
  int iVar4;
  uint uVar5;
  bool bVar6;
  int iVar7;
  bool bVar8;
  
  bVar6 = true;
  if ((*(uint *)&mon->field_0x60 >> 0x16 & 1) != 0) {
    if ((*(uint *)&mon->field_0x60 & 0x12000000) == 0) {
      bVar6 = mon->data != mons + 0x126 && mon->data != mons + 0x125;
    }
    else {
      bVar6 = false;
    }
  }
  if (obj == (obj *)0x0) {
    iVar7 = 9;
    if (u.uprops[0x13].blocked != 0) {
      iVar7 = 0x40;
    }
    if (u.uprops[0x13].extrinsic == 0 && u.uprops[0x13].intrinsic == 0) {
      iVar7 = 0x40;
    }
  }
  else {
    if (obj->oclass == '\x02') {
      bVar8 = objects[obj->otyp].oc_subtyp == '\x02';
    }
    else {
      bVar8 = false;
    }
    bVar3 = oprop_stealth_attack(obj,ostack,uwep,thrown);
    if (bVar3 != '\0') {
      oprop_id(0x4000,obj,ostack,uwep);
      goto LAB_00274eee;
    }
    if (thrown != '\0') {
      if ((obj->oclass == '\r') || (obj->oclass == '\x02')) {
        cVar1 = objects[obj->otyp].oc_subtyp;
        if ((-0x19 < cVar1) &&
           (((uwep != (obj *)0x0 && cVar1 < -0x15 &&
             ((int)cVar1 + (int)objects[uwep->otyp].oc_subtyp == 0)) &&
            (uVar5 = mt_random(), 0x55555555 < uVar5 * -0x55555555)))) goto LAB_00274eee;
      }
      if ((ushort)(obj->otyp - 7U) < 2 || bVar8) goto LAB_00274eee;
    }
    if ((bool)(bVar8 & (u.uprops[0x13].blocked == 0 &&
                       (u.uprops[0x13].extrinsic != 0 || u.uprops[0x13].intrinsic != 0))))
    goto LAB_00274eee;
    iVar7 = 9;
    if (u.uprops[0x13].blocked != 0 ||
        u.uprops[0x13].extrinsic == 0 && u.uprops[0x13].intrinsic == 0) {
      iVar7 = 0x40;
    }
    if (((obj->oclass != '\x02') || (obj->oartifact == '\x05')) || (obj->otyp == 0x41)) {
      iVar7 = 0x40;
    }
  }
  for (pmVar2 = level->monlist; pmVar2 != (monst *)0x0; pmVar2 = pmVar2->nmon) {
    iVar4 = dist2((int)mon->mx,(int)mon->my,(int)pmVar2->mx,(int)pmVar2->my);
    if ((iVar4 < iVar7) &&
       (bVar8 = urole.malenum != 0x164, uVar5 = mt_random(), uVar5 % ((uint)bVar8 * 2 + 3) != 0)) {
      pmVar2->field_0x62 = pmVar2->field_0x62 & 0xf7;
    }
  }
LAB_00274eee:
  bVar3 = hmon_hitmon(mon,obj,ostack,thrown);
  if (((mon->field_0x63 & 0x10) != 0) && (uVar5 = mt_random(), (uVar5 & 1) == 0)) {
    ghod_hitsu(mon);
  }
  if (!bVar6) {
    angry_guards(flags.soundok == '\0');
  }
  return bVar3;
}

Assistant:

boolean hmon(struct monst *mon, struct obj *obj,
	     struct obj *ostack, boolean thrown)
{
	boolean result, anger_guards;

	anger_guards = (mon->mpeaceful &&
			    (mon->ispriest || mon->isshk ||
			     mon->data == &mons[PM_WATCHMAN] ||
			     mon->data == &mons[PM_WATCH_CAPTAIN]));

	/* check to see if what we're doing would wake up nearby critters */
	noisy_hit(mon, obj, ostack, thrown);

	/* go ahead and 'hit' the monster */
	result = hmon_hitmon(mon, obj, ostack, thrown);

	if (mon->ispriest && !rn2(2))
	    ghod_hitsu(mon);
	if (anger_guards)
	    angry_guards(!flags.soundok);

	return result;
}